

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *window;
  ImGuiContext *ctx;
  ImGuiContext *pIVar5;
  ImU32 IVar6;
  ImDrawList *pIVar7;
  ImGuiWindow *pIVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  ImDrawList **ppIVar12;
  int iVar13;
  int n;
  ulong uVar14;
  int n_4;
  long lVar15;
  int n_2;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImVec2 cr_max;
  float fVar20;
  float fVar21;
  float fVar22;
  ImRect IVar23;
  ImGuiWindow *windows_to_render_top_most [2];
  
  ctx = GImGui;
  iVar13 = GImGui->FrameCountEnded;
  if (iVar13 != GImGui->FrameCount) {
    EndFrame();
    iVar13 = ctx->FrameCount;
  }
  iVar10 = ctx->FrameCountRendered;
  ctx->FrameCountRendered = iVar13;
  (ctx->IO).MetricsRenderWindows = 0;
  CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
  for (uVar14 = 0; pIVar5 = GImGui, uVar14 != (uint)(ctx->Viewports).Size; uVar14 = uVar14 + 1) {
    pIVar3 = (ctx->Viewports).Data[uVar14];
    ImDrawDataBuilder::Clear(&pIVar3->DrawDataBuilder);
    if (pIVar3->DrawLists[0] != (ImDrawList *)0x0) {
      pIVar7 = GetBackgroundDrawList(&pIVar3->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar7);
    }
  }
  if (iVar10 != iVar13) {
    pIVar8 = GetTopMostAndVisiblePopupModal();
    if ((0.0 < pIVar5->DimBgRatio) || (0.0 < pIVar5->NavWindowingHighlightAlpha)) {
      pIVar4 = pIVar5->NavWindowingTargetAnim;
      if (pIVar4 == (ImGuiWindow *)0x0) {
        cVar9 = '\0';
      }
      else {
        cVar9 = pIVar4->Active;
      }
      if ((pIVar8 != (ImGuiWindow *)0x0) || (cVar9 != '\0')) {
        if (pIVar8 == (ImGuiWindow *)0x0) {
          if (cVar9 != '\0') {
            IVar6 = GetColorU32(0x33,pIVar5->DimBgRatio);
            RenderDimmedBackgroundBehindWindow(pIVar4,IVar6);
            pIVar8 = pIVar5->NavWindowingTargetAnim;
            pIVar3 = *(GImGui->Viewports).Data;
            fVar20 = pIVar5->FontSize;
            IVar23 = ImGuiWindow::Rect(pIVar8);
            fVar17 = IVar23.Min.x - fVar20;
            fVar19 = IVar23.Min.y - fVar20;
            fVar21 = fVar20 + IVar23.Max.x;
            fVar22 = fVar20 + IVar23.Max.y;
            windows_to_render_top_most[0] = (ImGuiWindow *)CONCAT44(fVar19,fVar17);
            windows_to_render_top_most[1] = (ImGuiWindow *)CONCAT44(fVar22,fVar21);
            fVar18 = (pIVar3->super_ImGuiViewport).Size.x;
            if ((fVar18 <= fVar21 - fVar17) &&
               ((pIVar3->super_ImGuiViewport).Size.y <= fVar22 - fVar19)) {
              fVar20 = -1.0 - fVar20;
              windows_to_render_top_most[0] =
                   (ImGuiWindow *)CONCAT44(fVar19 - fVar20,fVar17 - fVar20);
              windows_to_render_top_most[1] =
                   (ImGuiWindow *)CONCAT44(fVar20 + fVar22,fVar20 + fVar21);
            }
            pIVar7 = pIVar8->DrawList;
            if ((pIVar7->CmdBuffer).Size == 0) {
              ImDrawList::AddDrawCmd(pIVar7);
              pIVar7 = pIVar8->DrawList;
              fVar18 = (pIVar3->super_ImGuiViewport).Size.x;
            }
            IVar2 = (pIVar3->super_ImGuiViewport).Pos;
            cr_max.x = fVar18 + IVar2.x;
            cr_max.y = (pIVar3->super_ImGuiViewport).Size.y + IVar2.y;
            ImDrawList::PushClipRect(pIVar7,IVar2,cr_max,false);
            pIVar7 = pIVar8->DrawList;
            IVar6 = GetColorU32(0x32,pIVar5->NavWindowingHighlightAlpha);
            ImDrawList::AddRect(pIVar7,(ImVec2 *)windows_to_render_top_most,
                                (ImVec2 *)(windows_to_render_top_most + 1),IVar6,
                                pIVar8->WindowRounding,0,3.0);
            ImDrawList::PopClipRect(pIVar8->DrawList);
          }
        }
        else {
          pIVar8 = FindBottomMostVisibleWindowWithinBeginStack(pIVar8);
          IVar6 = GetColorU32(0x34,pIVar5->DimBgRatio);
          RenderDimmedBackgroundBehindWindow(pIVar8,IVar6);
        }
      }
    }
  }
  pIVar8 = ctx->NavWindowingTarget;
  if (pIVar8 == (ImGuiWindow *)0x0) {
    windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    pIVar8 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar8->Flags & 0x2000) == 0) {
      windows_to_render_top_most[0] = pIVar8->RootWindow;
    }
    else {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    }
    pIVar8 = ctx->NavWindowingListWindow;
  }
  pIVar4 = windows_to_render_top_most[0];
  windows_to_render_top_most[1] = pIVar8;
  for (uVar14 = 0; uVar14 != (uint)(ctx->Windows).Size; uVar14 = uVar14 + 1) {
    window = (ctx->Windows).Data[uVar14];
    if (((window->Active == true) && (window->Hidden == false)) &&
       ((window != pIVar8 && window != pIVar4) && (window->Flags & 0x1000000) == 0)) {
      AddRootWindowToDrawData(window);
    }
  }
  for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
    pIVar8 = windows_to_render_top_most[lVar16];
    if (((pIVar8 != (ImGuiWindow *)0x0) && (pIVar8->Active == true)) && (pIVar8->Hidden == false)) {
      AddRootWindowToDrawData(pIVar8);
    }
  }
  if (((iVar10 != iVar13) && ((ctx->IO).MouseDrawCursor != false)) && (ctx->MouseCursor != -1)) {
    RenderMouseCursor((ctx->IO).MousePos,(ctx->Style).MouseCursorScale,ctx->MouseCursor,0xffffffff,
                      0xff000000,0x30000000);
  }
  (ctx->IO).MetricsRenderVertices = 0;
  (ctx->IO).MetricsRenderIndices = 0;
  for (lVar16 = 0; lVar16 < (ctx->Viewports).Size; lVar16 = lVar16 + 1) {
    pIVar3 = (ctx->Viewports).Data[lVar16];
    ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar3->DrawDataBuilder);
    if (pIVar3->DrawLists[1] != (ImDrawList *)0x0) {
      pIVar7 = GetForegroundDrawList(&pIVar3->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar7);
    }
    pIVar5 = GImGui;
    (pIVar3->DrawDataP).Valid = true;
    iVar13 = (pIVar3->DrawDataBuilder).Layers[0].Size;
    if (iVar13 < 1) {
      ppIVar12 = (ImDrawList **)0x0;
    }
    else {
      ppIVar12 = (pIVar3->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar3->DrawDataP).CmdLists = ppIVar12;
    (pIVar3->DrawDataP).CmdListsCount = iVar13;
    (pIVar3->DrawDataP).TotalIdxCount = 0;
    (pIVar3->DrawDataP).TotalVtxCount = 0;
    IVar2 = (pIVar3->super_ImGuiViewport).Size;
    (pIVar3->DrawDataP).DisplayPos = (pIVar3->super_ImGuiViewport).Pos;
    (pIVar3->DrawDataP).DisplaySize = IVar2;
    (pIVar3->DrawDataP).FramebufferScale = (pIVar5->IO).DisplayFramebufferScale;
    iVar10 = 0;
    iVar11 = 0;
    for (lVar15 = 0; lVar15 < iVar13; lVar15 = lVar15 + 1) {
      pIVar7 = (pIVar3->DrawDataBuilder).Layers[0].Data[lVar15];
      ImDrawList::_PopUnusedDrawCmd(pIVar7);
      iVar11 = (pIVar3->DrawDataP).TotalVtxCount + (pIVar7->VtxBuffer).Size;
      (pIVar3->DrawDataP).TotalVtxCount = iVar11;
      iVar10 = (pIVar3->DrawDataP).TotalIdxCount + (pIVar7->IdxBuffer).Size;
      (pIVar3->DrawDataP).TotalIdxCount = iVar10;
      iVar13 = (pIVar3->DrawDataBuilder).Layers[0].Size;
    }
    piVar1 = &(ctx->IO).MetricsRenderVertices;
    *piVar1 = *piVar1 + iVar11;
    piVar1 = &(ctx->IO).MetricsRenderIndices;
    *piVar1 = *piVar1 + iVar10;
  }
  CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}